

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O3

Var Js::JavascriptString::DoStringSplit
              (Arguments *args,CallInfo *callInfo,JavascriptString *input,
              ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  BOOL BVar5;
  uint32 uVar6;
  JavascriptArray *pJVar7;
  SparseArraySegmentBase *pSVar8;
  Var instance;
  JavascriptRegExp *thisObj;
  JavascriptString *match;
  undefined4 *puVar9;
  RecyclableObject *this;
  CharCount limit;
  char *message;
  char *error;
  Var pvVar10;
  uint lineNumber;
  char *fileName;
  
  uVar4 = *(uint *)&args->Info & 0xffffff;
  if (uVar4 == 1) goto LAB_00d16803;
  pvVar10 = (Var)0xffffffff;
  if (2 < uVar4) {
    instance = Arguments::operator[](args,2);
    BVar5 = JavascriptOperators::IsUndefinedObject(instance);
    if (BVar5 == 0) {
      pvVar10 = Arguments::operator[](args,2);
      if (((ulong)pvVar10 & 0x1ffff00000000) == 0x1000000000000 ||
          ((ulong)pvVar10 & 0xffff000000000000) != 0x1000000000000) {
        if (((ulong)pvVar10 & 0xffff000000000000) != 0x1000000000000) {
          uVar6 = JavascriptConversion::ToUInt32_Full(pvVar10,scriptContext);
          pvVar10 = (Var)(ulong)uVar6;
          goto LAB_00d16872;
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar3) goto LAB_00d16c9d;
        *puVar9 = 0;
      }
      if (((ulong)pvVar10 & 0x1ffff00000000) != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar3) goto LAB_00d16c9d;
        *puVar9 = 0;
      }
    }
  }
LAB_00d16872:
  limit = (CharCount)pvVar10;
  if (((scriptContext->config).threadConfig)->m_ES6RegExSymbols == false) {
    pvVar10 = Arguments::operator[](args,1);
    bVar3 = VarIs<Js::JavascriptRegExp>(pvVar10);
    if (bVar3) {
      pvVar10 = Arguments::operator[](args,1);
      thisObj = UnsafeVarTo<Js::JavascriptRegExp>(pvVar10);
      bVar3 = RegexHelper::IsResultNotUsed((uint)(byte)callInfo->field_0x3);
      pvVar10 = RegexHelper::RegexSplit
                          (scriptContext,(RecyclableObject *)thisObj,input,limit,bVar3,(void *)0x0);
      return pvVar10;
    }
  }
  pvVar10 = Arguments::operator[](args,1);
  match = JavascriptConversion::ToString(pvVar10,scriptContext);
  if ((callInfo->field_0x3 & 0x10) != 0) {
    return (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).nullValue.ptr;
  }
  if (limit == 0) {
    pJVar7 = JavascriptLibrary::CreateArray
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary,0);
    return pJVar7;
  }
  pvVar10 = Arguments::operator[](args,1);
  if (pvVar10 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00d16c9d;
    *puVar9 = 0;
LAB_00d16b8e:
    this = UnsafeVarTo<Js::RecyclableObject>(pvVar10);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00d16c9d;
      *puVar9 = 0;
    }
    TVar1 = ((this->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_Undefined) {
LAB_00d16803:
        pJVar7 = JavascriptLibrary::CreateArray
                           ((scriptContext->super_ScriptContextBase).javascriptLibrary,1);
        pSVar8 = JavascriptArray::GetLastUsedSegment(pJVar7);
        if ((pSVar8->left == 0) && (pSVar8->size != 0)) {
          JavascriptArray::DirectSetItemInLastUsedSegmentAt<Js::JavascriptString*>(pJVar7,0,input);
        }
        else {
          JavascriptArray::DirectSetItem_Full<Js::JavascriptString*>(pJVar7,0,input);
        }
        return pJVar7;
      }
      goto LAB_00d16c6f;
    }
    BVar5 = RecyclableObject::IsExternal(this);
    if (BVar5 != 0) goto LAB_00d16c6f;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
    ;
    error = "(typeId < TypeIds_Limit || obj->IsExternal())";
    message = "GetTypeId aValue has invalid TypeId";
    lineNumber = 0xe;
  }
  else {
    if (((ulong)pvVar10 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)pvVar10 & 0xffff000000000000) != 0x1000000000000) {
      if ((ulong)pvVar10 >> 0x32 != 0 || ((ulong)pvVar10 & 0xffff000000000000) == 0x1000000000000)
      goto LAB_00d16c6f;
      goto LAB_00d16b8e;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
    ;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
  }
  bVar3 = Throw::ReportAssert(fileName,lineNumber,error,message);
  if (!bVar3) {
LAB_00d16c9d:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar9 = 0;
LAB_00d16c6f:
  pvVar10 = RegexHelper::StringSplit(match,input,limit);
  return pvVar10;
}

Assistant:

Var JavascriptString::DoStringSplit(Arguments& args, CallInfo& callInfo, JavascriptString* input, ScriptContext* scriptContext)
    {
        if (args.Info.Count == 1)
        {
            JavascriptArray* ary = scriptContext->GetLibrary()->CreateArray(1);
            ary->DirectSetItemAt(0, input);
            return ary;
        }
        else
        {
            uint32 limit;
            if (args.Info.Count < 3 || JavascriptOperators::IsUndefinedObject(args[2]))
            {
                limit = UINT_MAX;
            }
            else
            {
                limit = JavascriptConversion::ToUInt32(args[2], scriptContext);
            }

            // When the config is enabled, the operation is handled by RegExp.prototype[@@split].
            if (!scriptContext->GetConfig()->IsES6RegExSymbolsEnabled()
                && VarIs<JavascriptRegExp>(args[1]))
            {
                return RegexHelper::RegexSplit(scriptContext, UnsafeVarTo<JavascriptRegExp>(args[1]), input, limit,
                    RegexHelper::IsResultNotUsed(callInfo.Flags));
            }
            else
            {
                JavascriptString* separator = JavascriptConversion::ToString(args[1], scriptContext);

                if (callInfo.Flags & CallFlags_NotUsed)
                {
                    return scriptContext->GetLibrary()->GetNull();
                }

                if (!limit)
                {
                    JavascriptArray* ary = scriptContext->GetLibrary()->CreateArray(0);
                    return ary;
                }

                if (JavascriptOperators::GetTypeId(args[1]) == TypeIds_Undefined)
                {
                    JavascriptArray* ary = scriptContext->GetLibrary()->CreateArray(1);
                    ary->DirectSetItemAt(0, input);
                    return ary;
                }

                return RegexHelper::StringSplit(separator, input, limit);
            }
        }
    }